

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O0

void __thiscall PixelToaster::DisplayAdapter::defaults(DisplayAdapter *this)

{
  Output local_18;
  Mode local_14;
  DisplayAdapter *local_10;
  DisplayAdapter *this_local;
  
  this->_title[0] = '\0';
  this->_width = 0;
  this->_height = 0;
  local_10 = this;
  Mode::Mode(&local_14,FloatingPoint);
  (this->_mode).enumeration = local_14.enumeration;
  Output::Output(&local_18,Default);
  (this->_output).enumeration = local_18.enumeration;
  this->_open = false;
  return;
}

Assistant:

virtual void defaults()
    {
        _title[0] = 0;
        _width    = 0;
        _height   = 0;
        _mode     = Mode::FloatingPoint;
        _output   = Output::Default;
        _open     = false;
    }